

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxread.c
# Opt level: O1

WebPMuxError
ChunkVerifyAndAssign(WebPChunk *chunk,uint8_t *data,size_t data_size,size_t riff_size,int copy_data)

{
  uint uVar1;
  WebPMuxError WVar2;
  ulong uVar3;
  WebPData chunk_data;
  WebPData local_10;
  
  WVar2 = WEBP_MUX_NOT_ENOUGH_DATA;
  if (7 < data_size) {
    uVar1 = *(uint *)(data + 4);
    WVar2 = WEBP_MUX_BAD_DATA;
    if (uVar1 < 0xfffffff7) {
      uVar3 = (ulong)(uVar1 + 1 & 0xfffffffe) + 8;
      if (data_size < uVar3 || riff_size < uVar3) {
        return (uint)(riff_size < uVar3) * 2 | WEBP_MUX_NOT_ENOUGH_DATA;
      }
      local_10.size = (size_t)uVar1;
      local_10.bytes = data + 8;
      WVar2 = ChunkAssignData(chunk,&local_10,copy_data,*(uint32_t *)data);
    }
  }
  return WVar2;
}

Assistant:

static WebPMuxError ChunkVerifyAndAssign(WebPChunk* chunk,
                                         const uint8_t* data, size_t data_size,
                                         size_t riff_size, int copy_data) {
  uint32_t chunk_size;
  WebPData chunk_data;

  // Correctness checks.
  if (data_size < CHUNK_HEADER_SIZE) return WEBP_MUX_NOT_ENOUGH_DATA;
  chunk_size = GetLE32(data + TAG_SIZE);
  if (chunk_size > MAX_CHUNK_PAYLOAD) return WEBP_MUX_BAD_DATA;

  {
    const size_t chunk_disk_size = SizeWithPadding(chunk_size);
    if (chunk_disk_size > riff_size) return WEBP_MUX_BAD_DATA;
    if (chunk_disk_size > data_size) return WEBP_MUX_NOT_ENOUGH_DATA;
  }

  // Data assignment.
  chunk_data.bytes = data + CHUNK_HEADER_SIZE;
  chunk_data.size = chunk_size;
  return ChunkAssignData(chunk, &chunk_data, copy_data, GetLE32(data + 0));
}